

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsDec
          (IntDigits *this,uint128 v,bool add_neg)

{
  char *pcVar1;
  char *pcVar2;
  uint128 uVar3;
  uint128 v_local;
  
  v_local.hi_ = v.hi_;
  v_local.lo_ = v.lo_;
  pcVar1 = &this->field_0x3d;
  do {
    pcVar2 = pcVar1;
    uVar3.hi_ = v_local.hi_;
    uVar3.lo_ = v_local.lo_;
    uVar3 = operator%(uVar3,(uint128)ZEXT816(100));
    numbers_internal::PutTwoDigits((uint32_t)uVar3.lo_,pcVar2 + -3);
    uint128::operator/=(&v_local,(uint128)ZEXT816(100));
    pcVar1 = pcVar2 + -2;
  } while (v_local.hi_ != 0 || v_local.lo_ != 0);
  pcVar1 = pcVar2 + -3;
  if (pcVar2[-3] == '0') {
    pcVar1 = pcVar2 + -2;
  }
  if (add_neg) {
    pcVar1[-1] = '-';
    pcVar1 = pcVar1 + -1;
  }
  this->size_ = (long)this + (0x3c - (long)pcVar1);
  this->start_ = pcVar1;
  return;
}

Assistant:

void PrintAsDec(uint128 v, bool add_neg = false) {
    // This function can be sped up if needed. We can call FastIntToBuffer
    // twice, or fix FastIntToBuffer to support uint128.
    char *p = storage_ + sizeof(storage_);
    do {
      p -= 2;
      numbers_internal::PutTwoDigits(static_cast<uint32_t>(v % 100), p);
      v /= 100;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many hexits.
      ++p;
    }
    if (add_neg) {
      *--p = '-';
    }
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
    start_ = p;
  }